

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Status_c2f(MPIABI_Status *c_status,MPIABI_Fint *f_status)

{
  int iVar1;
  MPI_Status *pMVar2;
  WPI_const_StatusPtr local_20;
  MPIABI_Fint *local_18;
  MPIABI_Fint *f_status_local;
  MPIABI_Status *c_status_local;
  
  local_18 = f_status;
  f_status_local = (MPIABI_Fint *)c_status;
  WPI_const_StatusPtr::WPI_const_StatusPtr(&local_20,c_status);
  pMVar2 = WPI_const_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_20);
  iVar1 = MPI_Status_c2f(pMVar2,local_18);
  WPI_const_StatusPtr::~WPI_const_StatusPtr(&local_20);
  return iVar1;
}

Assistant:

int MPIABI_Status_c2f(
  const MPIABI_Status * c_status,
  MPIABI_Fint * f_status
) {
  return MPI_Status_c2f(
    (const MPI_Status *)(WPI_const_StatusPtr)c_status,
    (MPI_Fint *)(WPI_Fint *)f_status
  );
}